

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O2

CSerializedNetMsg * __thiscall
NetMsg::
Make<int_const&,unsigned_long_const&,long_const&,unsigned_long_const&,ParamsWrapper<CAddress::SerParams,CService_const>>
          (CSerializedNetMsg *__return_storage_ptr__,NetMsg *this,string msg_type,int *args,
          unsigned_long *args_1,long *args_2,unsigned_long *args_3,
          ParamsWrapper<CAddress::SerParams,_const_CService> *args_4)

{
  long in_FS_OFFSET;
  VectorWriter VStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_type)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_type).field_2;
  (__return_storage_ptr__->m_type)._M_string_length = 0;
  (__return_storage_ptr__->m_type).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->m_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  VectorWriter::
  VectorWriter<int_const&,unsigned_long_const&,long_const&,unsigned_long_const&,ParamsWrapper<CAddress::SerParams,CService_const>>
            (&VStack_48,&__return_storage_ptr__->data,0,args,args_1,args_2,args_3,
             (ParamsWrapper<CAddress::SerParams,_const_CService> *)msg_type._M_dataplus._M_p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }